

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O1

void __thiscall
deqp::egl::anon_unknown_1::RobustnessTestCase::~RobustnessTestCase(RobustnessTestCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__RobustnessTestCase_02156d08;
  deinit(this);
  pcVar2 = (this->m_params).m_description._M_dataplus._M_p;
  paVar1 = &(this->m_params).m_description.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->m_params).m_name._M_dataplus._M_p;
  paVar1 = &(this->m_params).m_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  TestCase::~TestCase(&this->super_TestCase);
  return;
}

Assistant:

RobustnessTestCase::~RobustnessTestCase (void)
{
	deinit();
}